

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.cpp
# Opt level: O2

void __thiscall deqp::SubcaseBase::SubcaseBase(SubcaseBase *this)

{
  GLWrapper::GLWrapper(&this->super_GLWrapper);
  (this->super_GLWrapper)._vptr_GLWrapper = (_func_int **)&PTR__SubcaseBase_01dffb50;
  return;
}

Assistant:

SubcaseBase::SubcaseBase()
{
}